

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O0

void RDL_fillURFs(RDL_URFinfo *uInfo,RDL_cfURF *CFs)

{
  uint RCFIdx;
  void *__ptr;
  void *pvVar1;
  RDL_cfam ***URFs_00;
  uint *puVar2;
  char **alreadyInURF;
  uint k;
  uint j;
  uint i;
  uint currURFIdx;
  uint *nofRCFs;
  RDL_cfam ***URFs;
  RDL_cfURF *CFs_local;
  RDL_URFinfo *uInfo_local;
  
  j = 0;
  __ptr = malloc((ulong)uInfo->nofWeights << 3);
  for (k = 0; k < uInfo->nofWeights; k = k + 1) {
    pvVar1 = malloc((ulong)uInfo->nofProtos[k]);
    *(void **)((long)__ptr + (ulong)k * 8) = pvVar1;
  }
  for (k = 0; k < uInfo->nofWeights; k = k + 1) {
    for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofProtos[k];
        alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
      *(undefined1 *)(*(long *)((long)__ptr + (ulong)k * 8) + (ulong)alreadyInURF._4_4_) = 0;
    }
  }
  URFs_00 = (RDL_cfam ***)malloc((ulong)uInfo->nofURFs << 3);
  puVar2 = (uint *)malloc((ulong)uInfo->nofURFs << 2);
  for (k = 0; k < uInfo->nofURFs; k = k + 1) {
    puVar2[k] = 0;
  }
  for (k = 0; k < uInfo->nofWeights; k = k + 1) {
    for (alreadyInURF._4_4_ = 0; alreadyInURF._4_4_ < uInfo->nofProtos[k];
        alreadyInURF._4_4_ = alreadyInURF._4_4_ + 1) {
      if ((uInfo->URFrel[k][alreadyInURF._4_4_][alreadyInURF._4_4_] == '\x01') &&
         (*(char *)(*(long *)((long)__ptr + (ulong)k * 8) + (ulong)alreadyInURF._4_4_) == '\0')) {
        for (alreadyInURF._0_4_ = alreadyInURF._4_4_; (uint)alreadyInURF < uInfo->nofProtos[k];
            alreadyInURF._0_4_ = (uint)alreadyInURF + 1) {
          if (uInfo->URFrel[k][alreadyInURF._4_4_][(uint)alreadyInURF] == '\x01') {
            RCFIdx = RDL_idxWeight(uInfo,k,(uint)alreadyInURF);
            RDL_addRCFtoURF(RCFIdx,j,puVar2[j],URFs_00,CFs);
            puVar2[j] = puVar2[j] + 1;
            *(undefined1 *)(*(long *)((long)__ptr + (ulong)k * 8) + (ulong)(uint)alreadyInURF) = 1;
          }
        }
        j = j + 1;
      }
    }
  }
  for (k = 0; k < uInfo->nofWeights; k = k + 1) {
    free(*(void **)((long)__ptr + (ulong)k * 8));
  }
  free(__ptr);
  uInfo->URFs = URFs_00;
  uInfo->nofCFsPerURF = puVar2;
  return;
}

Assistant:

void RDL_fillURFs(RDL_URFinfo *uInfo, RDL_cfURF *CFs)
{
  RDL_cfam ***URFs;
  unsigned *nofRCFs;
  unsigned currURFIdx=0;
  unsigned i,j,k;
  char **alreadyInURF; /*for each weight: an array storing if a RCF is already
                        part of a URF*/

  alreadyInURF = malloc(uInfo->nofWeights * sizeof(*alreadyInURF));
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    alreadyInURF[i] = malloc(uInfo->nofProtos[i] * sizeof(*alreadyInURF[i]));
  }
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      alreadyInURF[i][j] = 0;
    }
  }

  URFs = malloc(uInfo->nofURFs * sizeof(*URFs));
  nofRCFs = malloc(uInfo->nofURFs * sizeof(*nofRCFs));
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    nofRCFs[i] = 0;
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    for(j=0; j<uInfo->nofProtos[i]; ++j)
    {
      /*if this family is not already part of a URF*/
      if((uInfo->URFrel[i][j][j] == 1) && (alreadyInURF[i][j] == 0))
      {
        for(k=j; k<uInfo->nofProtos[i]; ++k)
        {
          if(uInfo->URFrel[i][j][k] == 1)
          {
            /*add to current URF the CFs with the given Idx*/
            RDL_addRCFtoURF(RDL_idxWeight(uInfo,i,k),currURFIdx,
                            nofRCFs[currURFIdx],URFs,CFs);
            ++nofRCFs[currURFIdx];
            alreadyInURF[i][k] = 1;
          }
        }
        ++currURFIdx;
      }
    }
  }

  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(alreadyInURF[i]);
  }
  free(alreadyInURF);
  uInfo->URFs=URFs;
  uInfo->nofCFsPerURF = nofRCFs;
}